

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

char * mcpl_usage_progname(char *argv0)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  size_t sVar3;
  
  __s = mcpl_basename(argv0);
  sVar2 = strlen(__s);
  sVar3 = sVar2;
  if (4 < sVar2) {
    iVar1 = strcmp(__s + (sVar2 - 4),".exe");
    if (iVar1 != 0) {
      iVar1 = strcmp(__s + (sVar2 - 4),".EXE");
      sVar3 = 1;
      if (iVar1 != 0) goto LAB_00105ffd;
    }
    __s[sVar2 - 4] = '\0';
    sVar3 = sVar2 - 4;
  }
LAB_00105ffd:
  if ((sVar3 == 0) || (*__s == '.')) {
    free(__s);
    __s = mcpl_internal_malloc(9);
    builtin_strncpy(__s,"PROGNAME",9);
  }
  return __s;
}

Assistant:

char* mcpl_usage_progname( const char * argv0 )
{
  //Basically return the basename, but with any trailing .exe/.EXE discarded.
  char * bn = mcpl_basename(argv0);
  size_t npn = strlen(bn);
  const int has_exe_suffix = ( npn > 4
                               && ( strcmp(bn+(npn-4),".exe")==0
                                    || strcmp(bn+(npn-4),".EXE")==0 ) );
  if ( has_exe_suffix ) {
    npn -= 4;
    bn[npn] = '\0';
  }
  //Fallback to PROGNAME if empty or starts with a dot:
  if ( npn == 0 || bn[0]=='.' ) {
    free(bn);
    bn = mcpl_internal_malloc(9);
    memcpy(bn,"PROGNAME",9);
  }
  return bn;
}